

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O1

int __thiscall Algorithms::mobiusFunction(Algorithms *this,BigInteger *n)

{
  ulong uVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> fact;
  BigInteger local_60;
  BigInteger local_40;
  
  BigIntegerLibrary::BigInteger::BigInteger(&local_60,1);
  bVar4 = BigIntegerLibrary::BigInteger::operator==(n,&local_60);
  if (local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar7 = 1;
  if (!bVar4) {
    BigIntegerLibrary::BigInteger::BigInteger(&local_40,n);
    factorization((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>
                   *)&local_60,this,&local_40);
    if (local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar3 = local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar2 = local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      uVar5 = (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5;
      lVar6 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BigIntegerLibrary::BigInteger*,std::vector<BigIntegerLibrary::BigInteger,std::allocator<BigIntegerLibrary::BigInteger>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar2,piVar3);
    }
    uVar7 = 0xffffffff;
    if (0x20 < (ulong)((long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start)) {
      lVar6 = 0x20;
      uVar5 = 0;
      do {
        bVar4 = BigIntegerLibrary::BigInteger::operator!=
                          ((BigInteger *)
                           ((long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start + lVar6),
                           (BigInteger *)
                           ((long)local_60.num.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start + lVar6 + -0x20));
        if (!bVar4) {
          uVar7 = 0;
          goto LAB_0010904f;
        }
        uVar1 = uVar5 + 1;
        lVar6 = lVar6 + 0x20;
        uVar8 = uVar5 + 2;
        uVar5 = uVar1;
      } while (uVar8 < (ulong)((long)local_60.num.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_60.num.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 5));
      uVar7 = -(uint)((uVar1 & 1) == 0) | 1;
    }
LAB_0010904f:
    std::vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_>::
    ~vector((vector<BigIntegerLibrary::BigInteger,_std::allocator<BigIntegerLibrary::BigInteger>_> *
            )&local_60);
  }
  return uVar7;
}

Assistant:

int Algorithms::mobiusFunction(BigInteger n) {
    if (n == BigInteger(1)) {
        return 1;
    }
    auto fact = factorization(n);
    sort(fact.begin(), fact.end());
    int k = 1;
    for (int i = 1; i < fact.size(); ++i) {
        if (fact[i] != fact[i - 1]) {
            ++k;
        } else {
            return 0; // n % fact[i]^2 == 0
        }
    }
    if (k % 2) {
        return -1;
    }
    return 1;
}